

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darknet2ncnn.cpp
# Opt level: O2

void load_cfg(char *filename,deque<Section_*,_std::allocator<Section_*>_> *dnet)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  mapped_type *pmVar4;
  Section *pSVar5;
  int iVar6;
  Section *section;
  deque<Section_*,_std::allocator<Section_*>_> *local_2e8;
  ulong local_2e0;
  string line;
  string key;
  string local_298;
  string local_278;
  string value;
  ifstream icfg;
  byte abStack_218 [488];
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  local_2e8 = dnet;
  std::ifstream::ifstream(&icfg,filename,_S_in);
  if (*(int *)(abStack_218 + *(long *)(_icfg + -0x18)) != 0) {
    fprintf(_stderr,"Couldn\'t cfg open file: %s\n",filename);
    exit(1);
  }
  section = (Section *)0x0;
  iVar6 = 0;
  local_2e0 = 0;
  do {
    do {
      iVar6 = iVar6 + 1;
      if ((abStack_218[*(long *)(_icfg + -0x18)] & 2) != 0) {
        std::ifstream::close();
        std::ifstream::~ifstream(&icfg);
        std::__cxx11::string::~string((string *)&line);
        return;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&icfg,(string *)&line);
      trim(&line);
    } while ((line._M_string_length == 0) ||
            (pcVar2 = (char *)std::__cxx11::string::at((ulong)&line), *pcVar2 == '#'));
    pcVar2 = (char *)std::__cxx11::string::at((ulong)&line);
    if ((*pcVar2 == '[') &&
       (pcVar2 = (char *)std::__cxx11::string::at((ulong)&line), *pcVar2 == ']')) {
      std::__cxx11::string::substr((ulong)&key,(ulong)&line);
      std::__cxx11::string::operator=((string *)&line,(string *)&key);
      std::__cxx11::string::~string((string *)&key);
      pSVar5 = (Section *)operator_new(0x240);
      uVar1 = local_2e0;
      Section::Section(pSVar5);
      section = pSVar5;
      std::__cxx11::string::_M_assign((string *)pSVar5);
      section->line_number = iVar6;
      section->original_layer_count = (int)uVar1;
      std::deque<Section_*,_std::allocator<Section_*>_>::push_back(local_2e8,&section);
      local_2e0 = (ulong)((int)uVar1 + 1);
    }
    else {
      lVar3 = std::__cxx11::string::find((char)&line,0x3d);
      if (lVar3 != -1) {
        std::__cxx11::string::substr((ulong)&key,(ulong)&line);
        std::__cxx11::string::substr((ulong)&value,(ulong)&line);
        trim(&value);
        pSVar5 = section;
        trim(&key);
        pmVar4 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pSVar5->options,&key);
        std::__cxx11::string::_M_assign((string *)pmVar4);
        pSVar5 = section;
        std::__cxx11::string::string((string *)&local_298,(string *)&key);
        std::__cxx11::string::string((string *)&local_278,(string *)&value);
        update_field(pSVar5,&local_298,&local_278);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_298);
        std::__cxx11::string::~string((string *)&value);
        std::__cxx11::string::~string((string *)&key);
      }
    }
  } while( true );
}

Assistant:

void load_cfg(const char* filename, std::deque<Section*>& dnet)
{
    std::string line;
    std::ifstream icfg(filename, std::ifstream::in);
    if (!icfg.good())
    {
        fprintf(stderr, "Couldn't cfg open file: %s\n", filename);
        exit(EXIT_FAILURE);
    }

    Section* section = NULL;
    size_t pos;
    int section_count = 0, line_count = 0;
    while (!icfg.eof())
    {
        line_count++;
        std::getline(icfg, line);
        trim(line);
        if (line.length() == 0 || line.at(0) == '#')
            continue;
        if (line.at(0) == '[' && line.at(line.length() - 1) == ']')
        {
            line = line.substr(1, line.length() - 2);
            section = new Section;
            section->name = line;
            section->line_number = line_count;
            section->original_layer_count = section_count++;
            dnet.push_back(section);
        }
        else if ((pos = line.find_first_of('=')) != std::string::npos)
        {
            std::string key = line.substr(0, pos);
            std::string value = line.substr(pos + 1, line.length() - 1);
            section->options[trim(key)] = trim(value);
            update_field(section, key, value);
        }
    }

    icfg.close();
}